

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder.c
# Opt level: O0

void length(lzma_range_encoder *rc,lzma_length_encoder *lc,uint32_t pos_state,uint32_t len,
           _Bool fast_mode)

{
  uint32_t uVar1;
  _Bool fast_mode_local;
  uint32_t len_local;
  uint32_t pos_state_local;
  lzma_length_encoder *lc_local;
  lzma_range_encoder *rc_local;
  
  if (0x111 < len) {
    __assert_fail("len <= MATCH_LEN_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder.c"
                  ,0x6e,
                  "void length(lzma_range_encoder *, lzma_length_encoder *, const uint32_t, uint32_t, const _Bool)"
                 );
  }
  if (len - 2 < 8) {
    rc_bit(rc,&lc->choice,0);
    rc_bittree(rc,lc->low[pos_state],3,len - 2);
  }
  else {
    rc_bit(rc,&lc->choice,1);
    if (len - 10 < 8) {
      rc_bit(rc,&lc->choice2,0);
      rc_bittree(rc,lc->mid[pos_state],3,len - 10);
    }
    else {
      rc_bit(rc,&lc->choice2,1);
      rc_bittree(rc,lc->high,8,len - 0x12);
    }
  }
  if ((!fast_mode) &&
     (uVar1 = lc->counters[pos_state] - 1, lc->counters[pos_state] = uVar1, uVar1 == 0)) {
    length_update_prices(lc,pos_state);
  }
  return;
}

Assistant:

static inline void
length(lzma_range_encoder *rc, lzma_length_encoder *lc,
		const uint32_t pos_state, uint32_t len, const bool fast_mode)
{
	assert(len <= MATCH_LEN_MAX);
	len -= MATCH_LEN_MIN;

	if (len < LEN_LOW_SYMBOLS) {
		rc_bit(rc, &lc->choice, 0);
		rc_bittree(rc, lc->low[pos_state], LEN_LOW_BITS, len);
	} else {
		rc_bit(rc, &lc->choice, 1);
		len -= LEN_LOW_SYMBOLS;

		if (len < LEN_MID_SYMBOLS) {
			rc_bit(rc, &lc->choice2, 0);
			rc_bittree(rc, lc->mid[pos_state], LEN_MID_BITS, len);
		} else {
			rc_bit(rc, &lc->choice2, 1);
			len -= LEN_MID_SYMBOLS;
			rc_bittree(rc, lc->high, LEN_HIGH_BITS, len);
		}
	}

	// Only getoptimum uses the prices so don't update the table when
	// in fast mode.
	if (!fast_mode)
		if (--lc->counters[pos_state] == 0)
			length_update_prices(lc, pos_state);
}